

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O1

void StringFormatter<int&,char_const(&)[2]>::format<char_const[2]>
               (ostream *os,char *fmt,char (*value) [2])

{
  ostream *poVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  long lVar5;
  char (*pacVar6) [2];
  ostream oVar7;
  long lVar8;
  void *pvVar9;
  size_t sVar10;
  runtime_error *this;
  uint uVar11;
  char *pcVar12;
  bool bVar13;
  char *__nptr;
  ostream oVar14;
  char *pcVar15;
  char *q;
  char local_62;
  char local_61;
  undefined8 local_60;
  long local_58;
  char *local_50;
  long local_48;
  char (*local_40) [2];
  char *local_38;
  
  while( true ) {
    for (; cVar2 = *fmt, cVar2 == '%'; fmt = fmt + 2) {
      cVar2 = fmt[1];
      if (cVar2 != '%') {
        pcVar12 = fmt + (cVar2 == '-');
        cVar3 = fmt[(ulong)(cVar2 == '-') + 1];
        bVar13 = cVar3 == ' ' || cVar3 == '+';
        __nptr = pcVar12 + (ulong)bVar13 + 1;
        if (*__nptr == ',') {
          __nptr = pcVar12 + (ulong)bVar13 + 2;
          oVar14 = (ostream)0x2c;
        }
        else {
          oVar14 = (ostream)0x20;
          if (*__nptr == '0') {
            __nptr = pcVar12 + (ulong)bVar13 + 2;
            oVar14 = (ostream)0x30;
          }
        }
        local_48 = strtol(__nptr,&local_38,10);
        local_50 = local_38;
        local_40 = value;
        if (*local_38 == '.') {
          pcVar15 = local_38 + 1;
          lVar8 = strtol(pcVar15,&local_38,10);
          local_60 = CONCAT71((int7)((ulong)pcVar12 >> 8),pcVar15 != local_38);
          local_58 = (long)(int)lVar8;
        }
        else {
          local_58 = 0;
          local_60 = 0;
        }
        do {
          pcVar12 = local_38;
          cVar4 = *pcVar12;
          pvVar9 = memchr("qhlLzjt",(int)cVar4,8);
          local_38 = pcVar12 + 1;
        } while (pvVar9 != (void *)0x0);
        pcVar15 = pcVar12;
        if ((cVar4 == 'I') && (pcVar15 = pcVar12 + 1, (byte)(pcVar12[2] | 2U) == 0x36)) {
          pcVar15 = pcVar12 + 3;
        }
        cVar4 = *pcVar15;
        StringFormatter<int_&,_const_char_(&)[2]>::applytype(os,cVar4);
        lVar8 = *(long *)(*(long *)os + -0x18);
        if (cVar3 == '+') {
          uVar11 = *(uint *)(os + lVar8 + 0x18) | 0x800;
        }
        else {
          uVar11 = *(uint *)(os + lVar8 + 0x18) & 0xfffff7ff;
        }
        *(uint *)(os + lVar8 + 0x18) = uVar11;
        if (cVar2 == '-' || cVar3 == '+') {
          *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
               (uint)(cVar2 == '-') * 0x10 +
               (*(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffff4f) + 0x10;
        }
        lVar8 = *(long *)os;
        lVar5 = *(long *)(lVar8 + -0x18);
        if (__nptr == local_50) {
          *(undefined8 *)(os + lVar5 + 0x10) = 0;
        }
        else {
          *(long *)(os + lVar5 + 0x10) = (long)(int)local_48;
          if (cVar2 != '-' && cVar3 != '+') {
            lVar8 = *(long *)(lVar8 + -0x18);
            *(uint *)(os + lVar8 + 0x18) = *(uint *)(os + lVar8 + 0x18) & 0xffffff4f | 0x80;
          }
        }
        if ((char)local_60 != '\0') {
          *(long *)(os + *(long *)(*(long *)os + -0x18) + 8) = local_58;
        }
        poVar1 = os + *(long *)(*(long *)os + -0x18);
        if (os[*(long *)(*(long *)os + -0x18) + 0xe1] == (ostream)0x0) {
          oVar7 = (ostream)std::ios::widen((char)poVar1);
          poVar1[0xe0] = oVar7;
          poVar1[0xe1] = (ostream)0x1;
        }
        pacVar6 = local_40;
        poVar1[0xe0] = oVar14;
        sVar10 = strlen(*local_40);
        std::__ostream_insert<char,std::char_traits<char>>(os,*pacVar6,sVar10);
        *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 8) = 0;
        StringFormatter<int_&,_const_char_(&)[2]>::format(os,pcVar15 + (cVar4 != '\0'));
        return;
      }
      local_62 = cVar2;
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_62,1);
    }
    if (cVar2 == '\0') break;
    fmt = fmt + 1;
    local_61 = cVar2;
    std::__ostream_insert<char,std::char_traits<char>>(os,&local_61,1);
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"too many arguments for format");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void format(std::ostream& os, const char *fmt, T& value, FARGS&&...args) 
    {
        bool used_value = false;
        const char *p= fmt;
        while (*p) {
            if (*p=='%') {
                p++;
                if (*p=='%') {
                    os << *p++;
                }
                else {

                    // '-'  means left adjust
                    bool leftadjust= false;
                    if (*p=='-') {
                        p++;
                        leftadjust= true;
                    }
                    bool forcesign= false;
                    //bool blankforpositive= false;
                    if (*p=='+') {
                        p++;
                        forcesign= true;
                    }
                    else if (*p==' ') {
                        p++;
                        //blankforpositive= true;  // <-- todo
                    }
                    
                    // '0' means pad with zero
                    // ',' is useful for arrays
                    char padchar= ' ';

                    if (*p=='0') { p++; padchar='0'; }
                    else if (*p==',') { p++; padchar=','; }

                    // width specification
                    char *q;
                    // todo: support '*'  : take size from argumentlist.
                    // todo: support '#'  : adds 0, 0x, 0X prefix to oct/hex numbers -> 'showbase'
                    int width= strtol(p, &q, 10);
                    bool havewidth= p!=q;
                    p= q;

                    // precision after '.'
                    int precision= 0;
                    bool haveprecision= false;
                    if (*p=='.') {
                        p++;
                        // todo: support '*'
                        precision= strtol(p, &q, 10);
                        haveprecision= p!=q;
                        p= q;
                    }

                    // ignore argument size field
                    while (std::strchr("qhlLzjt", *p))
                        p++;
                    if (*p=='I') {
                        // microsoft I64 specifier
                        p++;
                        if (p[1]=='6' || p[1]=='4') {
                            p+=2;
                        }
                    }

                    char type= 0;
                    if (*p)
                        type= *p++;

                    // use formatting
                    applytype(os, type);
                    if (forcesign)
                        os << std::showpos;
                    else
                        os << std::noshowpos;

                    if (leftadjust)
                        os << std::left;
                    else if (forcesign) {
                        // exception: when forcing display of sign
                        // we need to use 'internal fill'
                        os << std::internal;
                    }

                    if (havewidth) {
                        os.width(width);
                        if (!leftadjust && !forcesign)
                            os << std::right;
                    }
                    else {
                        os.width(0);
                    }
                    // todo: support precision(truncate) for strings
                    if (haveprecision)
                        os.precision(precision);
                    os.fill(padchar);

                    if (type=='c' && output_wchar(os, value))
                    {
                        // nop
                    }
                    else if (type=='p' && output_pointer(os, value))
                    {
                        // nop
                    }
                    else if (type=='b' && output_hex_data(os, value))
                    {
                        // nop
                    }
                    else if (std::strchr("iduoxX", type) && output_int(os, value))
                    {
                        // nop
                    }
                    else if (type=='s' && output_null(os, value))
                    {
                        // nop
                    }
                    else if (output_using_operator(os, value))
                    {
                        // when type ~ float/double : '[AEFGaefg]' || type == 's' || other outputs failed.
                        // nop
                    }
                    else {
                        os << "<?>";
                    }

                    // TODO: improve float formatting

                    // reset precision
                    os.precision(0);

                    used_value = true;

                    format(os, p, args...);
                    return;
                }
            }
            else {
                os << *p++;
            }
        }

        if (!used_value)
            throw std::runtime_error("too many arguments for format");
    }